

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O1

Expression * __thiscall wasm::TranslateToFuzzReader::makeStringNewArray(TranslateToFuzzReader *this)

{
  Expression *ref;
  Expression *start;
  Expression *end;
  StringNew *pSVar1;
  undefined8 in_RDX;
  Array AVar2;
  undefined8 local_38;
  undefined8 local_30;
  HeapType local_28;
  
  local_38 = 2;
  local_30 = 0x100000002;
  AVar2.element._8_8_ = in_RDX;
  AVar2.element.type.id = (uintptr_t)&local_38;
  ::wasm::HeapType::HeapType(&local_28,AVar2);
  ref = makeTrappingRefUse(this,local_28);
  start = make(this,(Type)0x2);
  end = make(this,(Type)0x2);
  pSVar1 = Builder::makeStringNew(&this->builder,StringNewWTF16Array,ref,start,end);
  return (Expression *)pSVar1;
}

Assistant:

Expression* TranslateToFuzzReader::makeStringNewArray() {
  auto* array = makeTrappingRefUse(getArrayTypeForString());
  auto* start = make(Type::i32);
  auto* end = make(Type::i32);
  return builder.makeStringNew(StringNewWTF16Array, array, start, end);
}